

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void feintrack::copy_24to24_flip
               (uchar *dest_buf,uchar *src_buf,uint32_t src_width,uint32_t src_heght)

{
  uint uVar1;
  uint local_34;
  uchar *puStack_30;
  uint32_t i;
  uchar *from_ptr;
  uint32_t src_pitch;
  uint32_t src_heght_local;
  uint32_t src_width_local;
  uchar *src_buf_local;
  uchar *dest_buf_local;
  
  uVar1 = src_width * 3;
  _src_heght_local = src_buf + uVar1 * src_heght;
  src_buf_local = dest_buf;
  for (local_34 = 0; local_34 < src_heght; local_34 = local_34 + 1) {
    for (puStack_30 = _src_heght_local + -(ulong)uVar1; puStack_30 != _src_heght_local;
        puStack_30 = puStack_30 + 3) {
      *src_buf_local = *puStack_30;
      src_buf_local[1] = puStack_30[1];
      src_buf_local[2] = puStack_30[2];
      src_buf_local = src_buf_local + 3;
    }
    _src_heght_local = _src_heght_local + -(ulong)uVar1;
  }
  return;
}

Assistant:

void copy_24to24_flip(uchar* dest_buf, const uchar* src_buf, uint32_t src_width, uint32_t src_heght)
	{
        uint32_t src_pitch = 3 * src_width;
		src_buf += src_pitch * src_heght;
        const uchar* from_ptr(nullptr);
        for (uint32_t i = 0; i < src_heght; ++i)
		{
			from_ptr = src_buf - src_pitch;
			for (; from_ptr != src_buf; from_ptr += 3, dest_buf += 3)
			{
				dest_buf[0] = from_ptr[0];
				dest_buf[1] = from_ptr[1];
				dest_buf[2] = from_ptr[2];
			}
			src_buf -= src_pitch;
		}
	}